

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diag.cpp
# Opt level: O2

char * Mond::GetSeverityName(Severity s)

{
  invalid_argument *this;
  
  if (s < (Error|Warning)) {
    return &DAT_00128624 + *(int *)(&DAT_00128624 + (ulong)s * 4);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"unknown diagnostic severity");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

const char *Mond::GetSeverityName(Severity s)
{
	switch (s)
	{
	case Info:
		return "info";
	case Warning:
		return "warning";
	case Error:
		return "error";
	}

	throw invalid_argument("unknown diagnostic severity");
}